

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSON(QPDFJob *this,QPDF *pdf,Pipeline *p)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int json_version;
  undefined8 uVar1;
  element_type *peVar2;
  size_type sVar3;
  element_type *peVar4;
  element_type *this_01;
  Pipeline *this_02;
  bool bVar5;
  QPDFLogger local_328;
  reference local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  iterator __end3;
  iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_2e8 [8];
  JSON captured;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  JSON schema;
  key_type local_2a8;
  byte local_283;
  byte local_282;
  allocator<char> local_281;
  key_type local_280;
  byte local_25b;
  byte local_25a;
  allocator<char> local_259;
  key_type local_258;
  byte local_233;
  byte local_232;
  allocator<char> local_231;
  key_type local_230;
  byte local_20b;
  byte local_20a;
  allocator<char> local_209;
  key_type local_208;
  byte local_1e3;
  byte local_1e2;
  allocator<char> local_1e1;
  key_type local_1e0;
  byte local_1bb;
  byte local_1ba;
  allocator<char> local_1b9;
  key_type local_1b8;
  byte local_193;
  byte local_192;
  allocator<char> local_191;
  key_type local_190;
  byte local_16b;
  byte local_16a;
  allocator<char> local_169;
  key_type local_168;
  byte local_142;
  allocator<char> local_141;
  undefined1 local_140 [6];
  bool all_keys;
  JSON local_120;
  allocator<char> local_109;
  JSON local_108 [2];
  JSON local_e8;
  undefined1 local_d8 [8];
  string decode_level_str;
  JSON j_params;
  allocator<char> local_91;
  string local_90;
  bool local_6d [8];
  bool first;
  shared_ptr<Pl_String> local_60;
  undefined1 local_50 [8];
  shared_ptr<Pl_String> pl_str;
  string captured_json;
  Pipeline *p_local;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  captured_json.field_2._8_8_ = p;
  std::__cxx11::string::string
            ((string *)&pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<Pl_String>::shared_ptr((shared_ptr<Pl_String> *)local_50);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->test_json_schema & 1U) != 0) {
    std::make_shared<Pl_String,char_const(&)[13],Pipeline*&,std::__cxx11::string&>
              ((char (*) [13])&local_60,(Pipeline **)"capture json",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&captured_json.field_2 + 8));
    std::shared_ptr<Pl_String>::operator=((shared_ptr<Pl_String> *)local_50,&local_60);
    std::shared_ptr<Pl_String>::~shared_ptr(&local_60);
    captured_json.field_2._8_8_ =
         std::__shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2> *)local_50);
  }
  local_6d[0] = true;
  JSON::writeDictionaryOpen((Pipeline *)captured_json.field_2._8_8_,local_6d,0);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  uVar1 = captured_json.field_2._8_8_;
  if ((peVar2->json_output & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"version",&local_91);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    JSON::makeInt((JSON *)&j_params.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(long)peVar2->json_version);
    JSON::writeDictionaryItem
              ((Pipeline *)uVar1,local_6d,&local_90,
               (JSON *)&j_params.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,1);
    JSON::~JSON((JSON *)&j_params.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    JSON::makeDictionary();
    std::__cxx11::string::string((string *)local_d8);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    switch(peVar2->decode_level) {
    case qpdf_dl_none:
      std::__cxx11::string::operator=((string *)local_d8,"none");
      break;
    case qpdf_dl_generalized:
      std::__cxx11::string::operator=((string *)local_d8,"generalized");
      break;
    case qpdf_dl_specialized:
      std::__cxx11::string::operator=((string *)local_d8,"specialized");
      break;
    case qpdf_dl_all:
      std::__cxx11::string::operator=((string *)local_d8,"all");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"decodelevel",&local_109)
    ;
    JSON::makeString(&local_120,(string *)local_d8);
    JSON::addDictionaryMember(&local_e8,(string *)((long)&decode_level_str.field_2 + 8),local_108);
    JSON::~JSON(&local_e8);
    JSON::~JSON(&local_120);
    std::__cxx11::string::~string((string *)local_108);
    std::allocator<char>::~allocator(&local_109);
    uVar1 = captured_json.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_140,"parameters",&local_141);
    JSON::writeDictionaryItem
              ((Pipeline *)uVar1,local_6d,(string *)local_140,
               (JSON *)((long)&decode_level_str.field_2 + 8),1);
    std::__cxx11::string::~string((string *)local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string((string *)local_d8);
    JSON::~JSON((JSON *)((long)&decode_level_str.field_2 + 8));
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_142 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&peVar2->json_keys);
  local_16a = 0;
  local_16b = 0;
  bVar5 = true;
  if (!(bool)local_142) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    local_16a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"pages",&local_169);
    local_16b = 1;
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar2->json_keys,&local_168);
    bVar5 = sVar3 != 0;
  }
  if ((local_16b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_168);
  }
  if ((local_16a & 1) != 0) {
    std::allocator<char>::~allocator(&local_169);
  }
  if (bVar5) {
    doJSONPages(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
  }
  local_192 = 0;
  local_193 = 0;
  bVar5 = true;
  if ((local_142 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    local_192 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"pagelabels",&local_191)
    ;
    local_193 = 1;
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar2->json_keys,&local_190);
    bVar5 = sVar3 != 0;
  }
  if ((local_193 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_190);
  }
  if ((local_192 & 1) != 0) {
    std::allocator<char>::~allocator(&local_191);
  }
  if (bVar5) {
    doJSONPageLabels(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
  }
  local_1ba = 0;
  local_1bb = 0;
  bVar5 = true;
  if ((local_142 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    local_1ba = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"acroform",&local_1b9);
    local_1bb = 1;
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar2->json_keys,&local_1b8);
    bVar5 = sVar3 != 0;
  }
  if ((local_1bb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  if ((local_1ba & 1) != 0) {
    std::allocator<char>::~allocator(&local_1b9);
  }
  if (bVar5) {
    doJSONAcroform(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
  }
  local_1e2 = 0;
  local_1e3 = 0;
  bVar5 = true;
  if ((local_142 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    local_1e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"attachments",&local_1e1);
    local_1e3 = 1;
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar2->json_keys,&local_1e0);
    bVar5 = sVar3 != 0;
  }
  if ((local_1e3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  if ((local_1e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1e1);
  }
  if (bVar5) {
    doJSONAttachments(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
  }
  local_20a = 0;
  local_20b = 0;
  bVar5 = true;
  if ((local_142 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    local_20a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"encrypt",&local_209);
    local_20b = 1;
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar2->json_keys,&local_208);
    bVar5 = sVar3 != 0;
  }
  if ((local_20b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_208);
  }
  if ((local_20a & 1) != 0) {
    std::allocator<char>::~allocator(&local_209);
  }
  if (bVar5) {
    doJSONEncrypt(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
  }
  local_232 = 0;
  local_233 = 0;
  bVar5 = true;
  if ((local_142 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    local_232 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"outlines",&local_231);
    local_233 = 1;
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar2->json_keys,&local_230);
    bVar5 = sVar3 != 0;
  }
  if ((local_233 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_230);
  }
  if ((local_232 & 1) != 0) {
    std::allocator<char>::~allocator(&local_231);
  }
  if (bVar5) {
    doJSONOutlines(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
  }
  local_25a = 0;
  local_25b = 0;
  local_282 = 0;
  local_283 = 0;
  bVar5 = true;
  if ((local_142 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    local_25a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"objects",&local_259);
    local_25b = 1;
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar2->json_keys,&local_258);
    bVar5 = true;
    if (sVar3 == 0) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::allocator<char>::allocator();
      local_282 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"qpdf",&local_281);
      local_283 = 1;
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&peVar2->json_keys,&local_280);
      bVar5 = sVar3 != 0;
    }
  }
  if ((local_283 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((local_282 & 1) != 0) {
    std::allocator<char>::~allocator(&local_281);
  }
  if ((local_25b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_258);
  }
  if ((local_25a & 1) != 0) {
    std::allocator<char>::~allocator(&local_259);
  }
  if (bVar5) {
    doJSONObjects(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (peVar2->json_version == 1) {
    schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
         0;
    schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
         0;
    bVar5 = true;
    if ((local_142 & 1) == 0) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::allocator<char>::allocator();
      schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
           = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"objectinfo",
                 (allocator<char> *)
                 ((long)&schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
           = 1;
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&peVar2->json_keys,&local_2a8);
      bVar5 = sVar3 != 0;
    }
    if ((schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    if ((schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
    }
    if (bVar5) {
      doJSONObjectinfo(this,(Pipeline *)captured_json.field_2._8_8_,local_6d,pdf);
    }
  }
  JSON::writeDictionaryClose((Pipeline *)captured_json.field_2._8_8_,(bool)(local_6d[0] & 1),0);
  Pipeline::operator<<((Pipeline *)captured_json.field_2._8_8_,"\n");
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->test_json_schema & 1U) != 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    json_version = peVar2->json_version;
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    json_schema((QPDFJob *)
                &errors.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size,json_version,&peVar2->json_keys);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&captured.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    JSON::parse((JSON *)local_2e8,
                (string *)
                &pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    JSON::JSON((JSON *)&__range3,
               (JSON *)&errors.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node._M_size);
    bVar5 = JSON::checkSchema((JSON *)local_2e8,(JSON *)&__range3,
                              (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&captured.m.
                                  super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
    JSON::~JSON((JSON *)&__range3);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar2);
      QPDFLogger::error(peVar4,"QPDFJob didn\'t create JSON that complies with its own rules.\n");
      this_00 = &captured.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      __end3 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00);
      error = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
      while (bVar5 = std::operator!=(&__end3,(_Self *)&error), bVar5) {
        local_318 = std::
                    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end3);
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peVar2);
        QPDFLogger::getError(&local_328,SUB81(peVar4,0));
        this_01 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_328);
        this_02 = Pipeline::operator<<(this_01,local_318);
        Pipeline::operator<<(this_02,"\n");
        std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_328);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
    }
    JSON::~JSON((JSON *)local_2e8);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&captured.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           );
    JSON::~JSON((JSON *)&errors.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size);
  }
  std::shared_ptr<Pl_String>::~shared_ptr((shared_ptr<Pl_String> *)local_50);
  std::__cxx11::string::~string
            ((string *)&pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void
QPDFJob::doJSON(QPDF& pdf, Pipeline* p)
{
    // qpdf guarantees that no new top-level keys whose names start with "x-" will be added. These
    // are reserved for users.

    std::string captured_json;
    std::shared_ptr<Pl_String> pl_str;
    if (m->test_json_schema) {
        pl_str = std::make_shared<Pl_String>("capture json", p, captured_json);
        p = pl_str.get();
    }

    bool first = true;
    JSON::writeDictionaryOpen(p, first, 0);

    if (m->json_output) {
        // Exclude version and parameters to keep the output file minimal. The JSON version is
        // inside the "qpdf" key for version 2.
    } else {
        // This version is updated every time a non-backward-compatible change is made to the JSON
        // format. Clients of the JSON are to ignore unrecognized keys, so we only update the
        // version of a key disappears or if its value changes meaning.
        JSON::writeDictionaryItem(p, first, "version", JSON::makeInt(m->json_version), 1);
        JSON j_params = JSON::makeDictionary();
        std::string decode_level_str;
        switch (m->decode_level) {
        case qpdf_dl_none:
            decode_level_str = "none";
            break;
        case qpdf_dl_generalized:
            decode_level_str = "generalized";
            break;
        case qpdf_dl_specialized:
            decode_level_str = "specialized";
            break;
        case qpdf_dl_all:
            decode_level_str = "all";
            break;
        }
        j_params.addDictionaryMember("decodelevel", JSON::makeString(decode_level_str));
        JSON::writeDictionaryItem(p, first, "parameters", j_params, 1);
    }
    bool all_keys = m->json_keys.empty();
    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.

    // We do pages and pagelabels first since they have the side effect of repairing the pages tree,
    // which could potentially impact object references in remaining items.
    if (all_keys || m->json_keys.count("pages")) {
        doJSONPages(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("pagelabels")) {
        doJSONPageLabels(p, first, pdf);
    }

    // The non-special keys are output in alphabetical order, but the order doesn't actually matter.
    if (all_keys || m->json_keys.count("acroform")) {
        doJSONAcroform(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("attachments")) {
        doJSONAttachments(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("encrypt")) {
        doJSONEncrypt(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("outlines")) {
        doJSONOutlines(p, first, pdf);
    }

    // We do objects last so their information is consistent with repairing the page tree. To see
    // the original file with any page tree problems and the page tree not flattened, select
    // qpdf/objects/objectinfo without other keys.
    if (all_keys || m->json_keys.count("objects") || m->json_keys.count("qpdf")) {
        doJSONObjects(p, first, pdf);
    }
    if (m->json_version == 1) {
        // "objectinfo" is not needed for version >1 since you can tell streams from other objects
        // in "objects".
        if (all_keys || m->json_keys.count("objectinfo")) {
            doJSONObjectinfo(p, first, pdf);
        }
    }

    JSON::writeDictionaryClose(p, first, 0);
    *p << "\n";

    if (m->test_json_schema) {
        // Check against schema
        JSON schema = json_schema(m->json_version, &m->json_keys);
        std::list<std::string> errors;
        JSON captured = JSON::parse(captured_json);
        if (!captured.checkSchema(schema, errors)) {
            m->log->error("QPDFJob didn't create JSON that complies with its own rules.\n");
            for (auto const& error: errors) {
                *m->log->getError() << error << "\n";
            }
        }
    }
}